

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

IEEEFloat * __thiscall llvm::detail::IEEEFloat::operator=(IEEEFloat *this,IEEEFloat *rhs)

{
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  freeSignificand(this);
  this->semantics = rhs->semantics;
  this->significand = rhs->significand;
  this->exponent = rhs->exponent;
  this->field_0x12 = this->field_0x12 & 0xf8 | rhs->field_0x12 & 7;
  this->field_0x12 = this->field_0x12 & 0xf7 | ((byte)rhs->field_0x12 >> 3 & 1) << 3;
  rhs->semantics = (fltSemantics *)semBogus;
  return this;
}

Assistant:

IEEEFloat &IEEEFloat::operator=(IEEEFloat &&rhs) {
  freeSignificand();

  semantics = rhs.semantics;
  significand = rhs.significand;
  exponent = rhs.exponent;
  category = rhs.category;
  sign = rhs.sign;

  rhs.semantics = &semBogus;
  return *this;
}